

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFormat.cpp
# Opt level: O0

void slang::ast::SFormat::formatRaw2(string *result,ConstantValue *value)

{
  bool bVar1;
  uint32_t uVar2;
  bitwidth_t bVar3;
  uint64_t *__s;
  string *in_RSI;
  size_t bytes;
  uint32_t i;
  uint64_t *ptr;
  uint32_t lastBits;
  uint32_t words;
  SVInt sv;
  ConstantValue *elem;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ConstantValue,_18446744073709551615UL> *__range3;
  span<const_slang::ConstantValue,_18446744073709551615UL> *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  span<const_slang::ConstantValue,_18446744073709551615UL> *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  uint32_t uVar4;
  uint local_74;
  uint local_64;
  SVInt local_50;
  reference local_40;
  ConstantValue *local_38;
  __normal_iterator<const_slang::ConstantValue_*,_std::span<const_slang::ConstantValue,_18446744073709551615UL>_>
  local_30;
  span<const_slang::ConstantValue,_18446744073709551615UL> local_28;
  span<const_slang::ConstantValue,_18446744073709551615UL> *value_00;
  
  bVar1 = slang::ConstantValue::isUnpacked((ConstantValue *)0xa31744);
  if (bVar1) {
    local_28 = slang::ConstantValue::elements((ConstantValue *)0xa3175a);
    value_00 = &local_28;
    local_30._M_current =
         (ConstantValue *)
         std::span<const_slang::ConstantValue,_18446744073709551615UL>::begin
                   (in_stack_ffffffffffffff58);
    local_38 = (ConstantValue *)
               std::span<const_slang::ConstantValue,_18446744073709551615UL>::end
                         (in_stack_ffffffffffffff68);
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ConstantValue_*,_std::span<const_slang::ConstantValue,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ConstantValue_*,_std::span<const_slang::ConstantValue,_18446744073709551615UL>_>
                               *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                              (__normal_iterator<const_slang::ConstantValue_*,_std::span<const_slang::ConstantValue,_18446744073709551615UL>_>
                               *)in_stack_ffffffffffffff58), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_40 = __gnu_cxx::
                 __normal_iterator<const_slang::ConstantValue_*,_std::span<const_slang::ConstantValue,_18446744073709551615UL>_>
                 ::operator*(&local_30);
      formatRaw2(in_RSI,(ConstantValue *)value_00);
      __gnu_cxx::
      __normal_iterator<const_slang::ConstantValue_*,_std::span<const_slang::ConstantValue,_18446744073709551615UL>_>
      ::operator++(&local_30);
    }
  }
  else {
    slang::ConstantValue::integer((ConstantValue *)0xa317f4);
    SVInt::SVInt((SVInt *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                 (SVInt *)in_stack_ffffffffffffff58);
    SVInt::flattenUnknowns((SVInt *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    uVar2 = SVInt::getNumWords((SVInt *)0xa3181c);
    uVar4 = uVar2;
    bVar3 = SVInt::getBitWidth(&local_50);
    local_64 = bVar3 & 0x3f;
    if (local_64 == 0) {
      local_64 = 0x40;
    }
    __s = SVInt::getRawPtr((SVInt *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    for (local_74 = 0; local_74 < uVar2; local_74 = local_74 + 1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar4,in_stack_ffffffffffffff70),(char *)__s,
                 CONCAT17(local_74 == uVar2 - 1 && local_64 < 0x21,in_stack_ffffffffffffff60));
    }
    SVInt::~SVInt((SVInt *)CONCAT44(uVar4,in_stack_ffffffffffffff70));
  }
  return;
}

Assistant:

static void formatRaw2(std::string& result, const ConstantValue& value) {
    if (value.isUnpacked()) {
        for (auto& elem : value.elements())
            formatRaw2(result, elem);
        return;
    }

    SVInt sv = value.integer();
    sv.flattenUnknowns();

    uint32_t words = sv.getNumWords();
    uint32_t lastBits = sv.getBitWidth() % 64;
    if (lastBits == 0)
        lastBits = 64;

    const uint64_t* ptr = sv.getRawPtr();
    for (uint32_t i = 0; i < words; i++) {
        // Don't write the upper half of the last word if we don't actually have those bits.
        size_t bytes = (i == words - 1 && lastBits <= 32) ? sizeof(uint32_t) : sizeof(uint64_t);
        result.append(reinterpret_cast<const char*>(ptr + i), bytes);
    }
}